

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_reallocstack(lua_State *L,int newsize)

{
  int iVar1;
  StkId block;
  UpVal *pUVar2;
  StkId pTVar3;
  CallInfo *pCVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  block = L->stack;
  iVar1 = L->stacksize;
  lVar6 = (long)iVar1;
  lVar7 = (long)newsize;
  pTVar3 = (StkId)luaM_realloc_(L,block,lVar6 * 0x10,lVar7 * 0x10);
  L->stack = pTVar3;
  if (iVar1 < newsize) {
    piVar5 = &pTVar3[lVar6].tt_;
    lVar6 = lVar7 - lVar6;
    do {
      *piVar5 = 0;
      piVar5 = piVar5 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  L->stacksize = newsize;
  L->stack_last = pTVar3 + lVar7 + -5;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar3);
  pUVar2 = L->openupval;
  while (pUVar2 != (UpVal *)0x0) {
    pUVar2->v = (TValue *)(((long)pUVar2->v - (long)block) + (long)pTVar3);
    pUVar2 = (pUVar2->u).open.next;
  }
  for (pCVar4 = L->ci; pCVar4 != (CallInfo *)0x0; pCVar4 = pCVar4->previous) {
    pTVar3 = L->stack;
    pCVar4->top = (StkId)(((long)pCVar4->top - (long)block) + (long)pTVar3);
    pCVar4->func = (StkId)(((long)pCVar4->func - (long)block) + (long)pTVar3);
    if ((pCVar4->callstatus & 2) != 0) {
      (pCVar4->u).l.base = (StkId)((long)pTVar3 + ((long)(pCVar4->u).l.base - (long)block));
    }
  }
  return;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int lim = L->stacksize;
  StkId newstack = luaM_reallocvector(L, L->stack, lim, newsize, StackValue);
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  if (unlikely(newstack == NULL)) {  /* reallocation failed? */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  for (; lim < newsize; lim++)
    setnilvalue(s2v(newstack + lim)); /* erase new segment */
  correctstack(L, L->stack, newstack);
  L->stack = newstack;
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  return 1;
}